

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxFunctionCall::Resolve(FxFunctionCall *this,FCompileContext *ctx)

{
  PStruct *selfcls;
  PStruct *funccls;
  FRandom *pFVar1;
  FxExpression *pFVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Variant *pVVar6;
  FxVMFunctionCall *this_00;
  FxFunctionCall *pFVar7;
  FxFlopFunctionCall *this_01;
  undefined4 extraout_var;
  char *pcVar8;
  FxDynamicCast *this_02;
  FxExpression **ppFVar9;
  undefined4 extraout_var_00;
  FxRandom *pFVar10;
  FxSelf *this_03;
  FxConstant *this_04;
  FxConstant *this_05;
  FxMinMax *this_06;
  undefined4 extraout_var_01;
  FScriptPosition *pFVar11;
  PClass *pPVar12;
  FName *other;
  size_t sVar13;
  FArgumentList *pFVar14;
  FxRandom *local_408;
  FxExpression *local_338;
  PType *local_250;
  PType *local_248;
  PType *local_240;
  PType *local_238;
  PType *local_230;
  PType *local_228;
  PType *local_220;
  PType *local_218;
  PType *local_210;
  PType *local_208;
  FxConstant *local_1c8;
  FxSelf *local_198;
  FName local_150;
  FName local_14c;
  FName local_148;
  FName local_144;
  undefined1 local_140 [8];
  TArray<FxExpression_*,_FxExpression_*> pass;
  FName local_128;
  FName local_124;
  FName local_120;
  FName local_11c;
  FName local_118;
  FName local_114;
  FName local_110;
  FName local_10c;
  PType *local_108;
  PType *type;
  FxRandom *local_f8;
  FxExpression *func;
  FxExpression *x_3;
  PClass *local_e0;
  PClass *cls;
  FxExpression *x_2;
  FxConstant *local_c8;
  undefined1 local_b9;
  FxConstant *local_b8;
  FxConstant *local_b0;
  FxExpression *self_1;
  int paramcount;
  int special;
  int max;
  int min;
  FxExpression *x_1;
  size_t i;
  FxVMFunctionCall *x;
  undefined1 local_69;
  FxSelf *local_68;
  FxSelf *local_60;
  FxSelf *self;
  PFunction *local_50;
  PFunction *afd;
  FxExpression *a;
  iterator __end1;
  iterator __begin1;
  FArgumentList *__range1;
  FCompileContext *pFStack_20;
  bool error;
  FCompileContext *ctx_local;
  FxFunctionCall *this_local;
  
  pFStack_20 = ctx;
  ctx_local = (FCompileContext *)this;
  if (ctx->Class == (PStruct *)0x0) {
    if (this != (FxFunctionCall *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return &((FxFunctionCall *)0x0)->super_FxExpression;
  }
  __range1._7_1_ = 0;
  __end1 = TArray<FxExpression_*,_FxExpression_*>::begin
                     (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
  a = (FxExpression *)
      TArray<FxExpression_*,_FxExpression_*>::end
                (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
  while (bVar3 = TIterator<FxExpression_*>::operator!=(&__end1,(TIterator<FxExpression_*> *)&a),
        bVar3) {
    ppFVar9 = TIterator<FxExpression_*>::operator*(&__end1);
    afd = (PFunction *)*ppFVar9;
    if (afd == (PFunction *)0x0) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Empty function argument.");
      if (this != (FxFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return &((FxFunctionCall *)0x0)->super_FxExpression;
    }
    TIterator<FxExpression_*>::operator++(&__end1);
  }
  selfcls = pFStack_20->Class;
  funccls = pFStack_20->Class;
  FName::FName((FName *)((long)&self + 4),&this->MethodName);
  local_50 = FindClassMemberFunction
                       (selfcls,funccls,(FName *)((long)&self + 4),
                        &(this->super_FxExpression).ScriptPosition,(bool *)((long)&__range1 + 7));
  if (local_50 != (PFunction *)0x0) {
    bVar3 = CheckFunctionCompatiblity
                      (&(this->super_FxExpression).ScriptPosition,pFStack_20->Function,local_50);
    if (!bVar3) {
      if (this != (FxFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return &((FxFunctionCall *)0x0)->super_FxExpression;
    }
    pFVar11 = (FScriptPosition *)0x0;
    pVVar6 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&local_50->Variants,0);
    local_69 = 0;
    if ((pVVar6->Flags & 2) == 0) {
      local_198 = (FxSelf *)0x0;
    }
    else {
      local_198 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar11);
      local_69 = 1;
      pFVar11 = &(this->super_FxExpression).ScriptPosition;
      local_68 = local_198;
      FxSelf::FxSelf(local_198,pFVar11,false);
    }
    local_60 = local_198;
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x68,(size_t)pFVar11);
    FxVMFunctionCall::FxVMFunctionCall
              (this_00,&local_60->super_FxExpression,local_50,&this->ArgList,
               &(this->super_FxExpression).ScriptPosition,false);
    i = (size_t)this_00;
    if (this != (FxFunctionCall *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    pFVar7 = (FxFunctionCall *)(**(code **)(*(long *)i + 0x10))(i,pFStack_20);
    return &pFVar7->super_FxExpression;
  }
  local_50 = (PFunction *)0x0;
  for (x_1 = (FxExpression *)0x0; x_1 < (FxExpression *)0xf;
      x_1 = (FxExpression *)((long)&x_1->_vptr_FxExpression + 1)) {
    sVar13 = (size_t)FxFlops[(long)x_1].Name;
    bVar3 = FName::operator==(&this->MethodName,FxFlops[(long)x_1].Name);
    if (bVar3) {
      this_01 = (FxFlopFunctionCall *)FxExpression::operator_new((FxExpression *)0x40,sVar13);
      FxFlopFunctionCall::FxFlopFunctionCall
                (this_01,(size_t)x_1,&this->ArgList,&(this->super_FxExpression).ScriptPosition);
      _max = this_01;
      if (this != (FxFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      iVar4 = (*(_max->super_FxExpression)._vptr_FxExpression[2])(_max,pFStack_20);
      return &((FxFunctionCall *)CONCAT44(extraout_var,iVar4))->super_FxExpression;
    }
  }
  pPVar12 = (PClass *)0xfb;
  bVar3 = FName::operator==(&this->MethodName,NAME_ACS_NamedExecuteWithResult);
  if (bVar3) {
LAB_00772682:
    self_1._4_4_ = -0x54;
    special = 1;
    paramcount = 5;
  }
  else {
    pPVar12 = (PClass *)0xfc;
    bVar3 = FName::operator==(&this->MethodName,NAME_CallACS);
    if (bVar3) goto LAB_00772682;
    pcVar8 = FName::GetChars(&this->MethodName);
    pPVar12 = (PClass *)&special;
    self_1._4_4_ = P_FindLineSpecial(pcVar8,(int *)pPVar12,&paramcount);
  }
  if ((self_1._4_4_ == 0) || (special < 0)) {
    other = &this->MethodName;
    FName::FName((FName *)((long)&x_3 + 4),other);
    local_e0 = PClass::FindClass((FName *)((long)&x_3 + 4));
    if ((local_e0 != (PClass *)0x0) && ((local_e0->bExported & 1U) != 0)) {
      FName::FName((FName *)&x_3,&this->MethodName);
      pFVar14 = &this->ArgList;
      bVar3 = CheckArgSize((FName *)&x_3,pFVar14,1,1,&(this->super_FxExpression).ScriptPosition);
      if (!bVar3) {
        if (this != (FxFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        return &((FxFunctionCall *)0x0)->super_FxExpression;
      }
      this_02 = (FxDynamicCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar14);
      pPVar12 = local_e0;
      ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
      FxDynamicCast::FxDynamicCast(this_02,pPVar12,*ppFVar9);
      func = (FxExpression *)this_02;
      ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
      *ppFVar9 = (FxExpression *)0x0;
      if (this != (FxFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      iVar4 = (*func->_vptr_FxExpression[2])(func,pFStack_20);
      return &((FxFunctionCall *)CONCAT44(extraout_var_00,iVar4))->super_FxExpression;
    }
    local_f8 = (FxRandom *)0x0;
    iVar4 = FName::operator_cast_to_int(&this->MethodName);
    if (iVar4 == 0xd1) {
      uVar5 = TArray<FxExpression_*,_FxExpression_*>::Size
                        (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
      if (uVar5 == 0) {
        pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x48,(size_t)other);
        pFVar1 = this->RNG;
        this_04 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)other);
        sVar13 = 0;
        FxConstant::FxConstant(this_04,0,&(this->super_FxExpression).ScriptPosition);
        this_05 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
        FxConstant::FxConstant(this_05,0xff,&(this->super_FxExpression).ScriptPosition);
        FxRandom::FxRandom(pFVar10,pFVar1,(FxExpression *)this_04,(FxExpression *)this_05,
                           &(this->super_FxExpression).ScriptPosition,
                           (bool)(pFStack_20->FromDecorate & 1));
        local_f8 = pFVar10;
      }
      else {
        FName::FName(&local_114,NAME_Random);
        pFVar14 = &this->ArgList;
        bVar3 = CheckArgSize(&local_114,pFVar14,2,2,&(this->super_FxExpression).ScriptPosition);
        if (bVar3) {
          pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pFVar14);
          pFVar1 = this->RNG;
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          pFVar2 = *ppFVar9;
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,1);
          FxRandom::FxRandom(pFVar10,pFVar1,pFVar2,*ppFVar9,
                             &(this->super_FxExpression).ScriptPosition,
                             (bool)(pFStack_20->FromDecorate & 1));
          local_f8 = pFVar10;
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,1);
          *ppFVar9 = (FxExpression *)0x0;
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          *ppFVar9 = (FxExpression *)0x0;
        }
      }
    }
    else if (iVar4 == 0xd2) {
      FName::FName(&local_118,NAME_FRandom);
      pFVar14 = &this->ArgList;
      bVar3 = CheckArgSize(&local_118,pFVar14,2,2,&(this->super_FxExpression).ScriptPosition);
      if (bVar3) {
        pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pFVar14);
        pFVar1 = this->RNG;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        pFVar2 = *ppFVar9;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,1);
        FxFRandom::FxFRandom
                  ((FxFRandom *)pFVar10,pFVar1,pFVar2,*ppFVar9,
                   &(this->super_FxExpression).ScriptPosition);
        local_f8 = pFVar10;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,1);
        *ppFVar9 = (FxExpression *)0x0;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        *ppFVar9 = (FxExpression *)0x0;
      }
    }
    else if (iVar4 == 0xd3) {
      FName::FName(&local_120,NAME_Random2);
      pFVar14 = &this->ArgList;
      bVar3 = CheckArgSize(&local_120,pFVar14,0,1,&(this->super_FxExpression).ScriptPosition);
      if (bVar3) {
        pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pFVar14);
        pFVar1 = this->RNG;
        uVar5 = TArray<FxExpression_*,_FxExpression_*>::Size
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
        if (uVar5 == 0) {
          local_338 = (FxExpression *)0x0;
        }
        else {
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          local_338 = *ppFVar9;
        }
        FxRandom2::FxRandom2
                  ((FxRandom2 *)pFVar10,pFVar1,local_338,&(this->super_FxExpression).ScriptPosition,
                   (bool)(pFStack_20->FromDecorate & 1));
        local_f8 = pFVar10;
        uVar5 = TArray<FxExpression_*,_FxExpression_*>::Size
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
        if (uVar5 != 0) {
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          *ppFVar9 = (FxExpression *)0x0;
        }
      }
    }
    else if (iVar4 - 0xd4U < 2) {
      FName::FName(&local_11c,&this->MethodName);
      pFVar14 = &this->ArgList;
      bVar3 = CheckArgSize(&local_11c,pFVar14,1,-1,&(this->super_FxExpression).ScriptPosition);
      if (bVar3) {
        pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pFVar14);
        pFVar1 = this->RNG;
        bVar3 = FName::operator==(&this->MethodName,NAME_FRandomPick);
        FxRandomPick::FxRandomPick
                  ((FxRandomPick *)pFVar10,pFVar1,
                   &(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,bVar3,
                   &(this->super_FxExpression).ScriptPosition,(bool)(pFStack_20->FromDecorate & 1));
        local_f8 = pFVar10;
      }
    }
    else if (iVar4 == 0xd6) {
      FName::FName(&local_10c,NAME_GetClass);
      pFVar14 = &this->ArgList;
      bVar3 = CheckArgSize(&local_10c,pFVar14,0,0,&(this->super_FxExpression).ScriptPosition);
      if (bVar3) {
        pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar14);
        this_03 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar14);
        FxSelf::FxSelf(this_03,&(this->super_FxExpression).ScriptPosition,false);
        FxGetClass::FxGetClass((FxGetClass *)pFVar10,(FxExpression *)this_03);
        local_f8 = pFVar10;
      }
    }
    else if (iVar4 == 0xd7) {
      FName::FName(&local_110,NAME_GetDefaultByType);
      pFVar14 = &this->ArgList;
      bVar3 = CheckArgSize(&local_110,pFVar14,1,1,&(this->super_FxExpression).ScriptPosition);
      if (bVar3) {
        pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar14);
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        FxGetDefaultByType::FxGetDefaultByType((FxGetDefaultByType *)pFVar10,*ppFVar9);
        local_f8 = pFVar10;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        *ppFVar9 = (FxExpression *)0x0;
      }
    }
    else if (iVar4 - 0xe4U < 2) {
      FName::FName(&local_150,&this->MethodName);
      bVar3 = CheckArgSize(&local_150,&this->ArgList,2,2,&(this->super_FxExpression).ScriptPosition)
      ;
      if (bVar3) {
        sVar13 = 0xe4;
        bVar3 = FName::operator==(&this->MethodName,NAME_ATan2);
        if (bVar3) {
          local_408 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          pFVar2 = *ppFVar9;
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,1);
          FxATan2::FxATan2((FxATan2 *)local_408,pFVar2,*ppFVar9,
                           &(this->super_FxExpression).ScriptPosition);
        }
        else {
          local_408 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,1);
          pFVar2 = *ppFVar9;
          ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          FxATan2::FxATan2((FxATan2 *)local_408,pFVar2,*ppFVar9,
                           &(this->super_FxExpression).ScriptPosition);
        }
        local_f8 = local_408;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,1);
        *ppFVar9 = (FxExpression *)0x0;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        *ppFVar9 = (FxExpression *)0x0;
      }
    }
    else if (iVar4 == 0xfa) {
      FName::FName(&local_14c,&this->MethodName);
      pFVar14 = &this->ArgList;
      bVar3 = CheckArgSize(&local_14c,pFVar14,1,1,&(this->super_FxExpression).ScriptPosition);
      if (bVar3) {
        pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar14);
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        FxAbs::FxAbs((FxAbs *)pFVar10,*ppFVar9);
        local_f8 = pFVar10;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        *ppFVar9 = (FxExpression *)0x0;
      }
    }
    else if (iVar4 == 0x10b) {
      FName::FName((FName *)&pass.Count,&this->MethodName);
      bVar3 = CheckArgSize((FName *)&pass.Count,&this->ArgList,3,3,
                           &(this->super_FxExpression).ScriptPosition);
      if (bVar3) {
        TArray<FxExpression_*,_FxExpression_*>::TArray
                  ((TArray<FxExpression_*,_FxExpression_*> *)local_140);
        TArray<FxExpression_*,_FxExpression_*>::Resize
                  ((TArray<FxExpression_*,_FxExpression_*> *)local_140,2);
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        pFVar2 = *ppFVar9;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            ((TArray<FxExpression_*,_FxExpression_*> *)local_140,0);
        *ppFVar9 = pFVar2;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,1);
        pFVar2 = *ppFVar9;
        sVar13 = 1;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            ((TArray<FxExpression_*,_FxExpression_*> *)local_140,1);
        *ppFVar9 = pFVar2;
        this_06 = (FxMinMax *)FxExpression::operator_new((FxExpression *)0x40,sVar13);
        FName::FName(&local_144,NAME_Max);
        FxMinMax::FxMinMax(this_06,(TArray<FxExpression_*,_FxExpression_*> *)local_140,&local_144,
                           &(this->super_FxExpression).ScriptPosition);
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            ((TArray<FxExpression_*,_FxExpression_*> *)local_140,0);
        *ppFVar9 = (FxExpression *)this_06;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,2);
        pFVar2 = *ppFVar9;
        sVar13 = 1;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            ((TArray<FxExpression_*,_FxExpression_*> *)local_140,1);
        *ppFVar9 = pFVar2;
        pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x40,sVar13);
        FName::FName(&local_148,NAME_Min);
        FxMinMax::FxMinMax((FxMinMax *)pFVar10,(TArray<FxExpression_*,_FxExpression_*> *)local_140,
                           &local_148,&(this->super_FxExpression).ScriptPosition);
        local_f8 = pFVar10;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,2);
        *ppFVar9 = (FxExpression *)0x0;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,1);
        *ppFVar9 = (FxExpression *)0x0;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        *ppFVar9 = (FxExpression *)0x0;
        TArray<FxExpression_*,_FxExpression_*>::~TArray
                  ((TArray<FxExpression_*,_FxExpression_*> *)local_140);
      }
    }
    else {
      if (iVar4 != 0x1ea) {
        if (iVar4 == 0x204) {
          uVar5 = TArray<FxExpression_*,_FxExpression_*>::Size
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
          if ((uVar5 == 3) ||
             (uVar5 = TArray<FxExpression_*,_FxExpression_*>::Size
                                (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>),
             uVar5 == 4)) {
            pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x40,(size_t)other);
            FxColorLiteral::FxColorLiteral
                      ((FxColorLiteral *)pFVar10,&this->ArgList,
                       &(this->super_FxExpression).ScriptPosition);
            local_f8 = pFVar10;
            goto LAB_0077402b;
          }
        }
        else if ((((2 < iVar4 - 0x24eU) && (iVar4 != 0x255)) && (iVar4 != 600)) &&
                (1 < iVar4 - 0x25eU)) {
          if (iVar4 - 0x264U < 2) {
            FName::FName(&local_124,&this->MethodName);
            pFVar14 = &this->ArgList;
            bVar3 = CheckArgSize(&local_124,pFVar14,2,-1,&(this->super_FxExpression).ScriptPosition)
            ;
            if (bVar3) {
              pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pFVar14)
              ;
              FName::FName(&local_128,&this->MethodName);
              FxMinMax::FxMinMax((FxMinMax *)pFVar10,
                                 &(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                 &local_128,&(this->super_FxExpression).ScriptPosition);
              local_f8 = pFVar10;
            }
            goto LAB_0077402b;
          }
          if (1 < iVar4 - 0x27cU) {
            pcVar8 = FName::GetChars(&this->MethodName);
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Call to unknown function \'%s\'",pcVar8);
            goto LAB_0077402b;
          }
        }
      }
      FName::FName((FName *)((long)&type + 4),&this->MethodName);
      bVar3 = CheckArgSize((FName *)((long)&type + 4),&this->ArgList,1,1,
                           &(this->super_FxExpression).ScriptPosition);
      if (bVar3) {
        sVar13 = 0x250;
        bVar3 = FName::operator==(&this->MethodName,NAME_Bool);
        if (bVar3) {
          local_208 = (PType *)TypeBool;
        }
        else {
          sVar13 = 0x24e;
          bVar3 = FName::operator==(&this->MethodName,NAME_Int);
          if (bVar3) {
            local_210 = (PType *)TypeSInt32;
          }
          else {
            sVar13 = 0x24f;
            bVar3 = FName::operator==(&this->MethodName,NAME_uInt);
            if (bVar3) {
              local_218 = (PType *)TypeUInt32;
            }
            else {
              sVar13 = 0x255;
              bVar3 = FName::operator==(&this->MethodName,NAME_Float);
              if (bVar3) {
                local_220 = (PType *)TypeFloat64;
              }
              else {
                sVar13 = 600;
                bVar3 = FName::operator==(&this->MethodName,NAME_Double);
                if (bVar3) {
                  local_228 = (PType *)TypeFloat64;
                }
                else {
                  sVar13 = 0x1ea;
                  bVar3 = FName::operator==(&this->MethodName,NAME_Name);
                  if (bVar3) {
                    local_230 = (PType *)TypeName;
                  }
                  else {
                    sVar13 = 0x27c;
                    bVar3 = FName::operator==(&this->MethodName,NAME_SpriteID);
                    if (bVar3) {
                      local_238 = (PType *)TypeSpriteID;
                    }
                    else {
                      sVar13 = 0x27d;
                      bVar3 = FName::operator==(&this->MethodName,NAME_TextureID);
                      if (bVar3) {
                        local_240 = (PType *)TypeTextureID;
                      }
                      else {
                        sVar13 = 0x25f;
                        bVar3 = FName::operator==(&this->MethodName,NAME_State);
                        if (bVar3) {
                          local_248 = (PType *)TypeState;
                        }
                        else {
                          sVar13 = 0x204;
                          bVar3 = FName::operator==(&this->MethodName,NAME_Color);
                          if (bVar3) {
                            local_250 = (PType *)TypeColor;
                          }
                          else {
                            local_250 = (PType *)TypeSound;
                          }
                          local_248 = local_250;
                        }
                        local_240 = local_248;
                      }
                      local_238 = local_240;
                    }
                    local_230 = local_238;
                  }
                  local_228 = local_230;
                }
                local_220 = local_228;
              }
              local_218 = local_220;
            }
            local_210 = local_218;
          }
          local_208 = local_210;
        }
        local_108 = local_208;
        pFVar10 = (FxRandom *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        FxTypeCast::FxTypeCast((FxTypeCast *)pFVar10,*ppFVar9,local_108,true,true);
        local_f8 = pFVar10;
        ppFVar9 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        *ppFVar9 = (FxExpression *)0x0;
      }
    }
LAB_0077402b:
    if (local_f8 != (FxRandom *)0x0) {
      if (this != (FxFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      iVar4 = (*(local_f8->super_FxExpression)._vptr_FxExpression[2])(local_f8,pFStack_20);
      return &((FxFunctionCall *)CONCAT44(extraout_var_01,iVar4))->super_FxExpression;
    }
    if (this != (FxFunctionCall *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return &((FxFunctionCall *)0x0)->super_FxExpression;
  }
  self_1._0_4_ = TArray<FxExpression_*,_FxExpression_*>::Size
                           (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
  if ((int)(uint)self_1 < special) {
    pcVar8 = FName::GetChars(&this->MethodName);
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,
               "Not enough parameters for \'%s\' (expected %d, got %d)",pcVar8,(ulong)(uint)special,
               (ulong)(uint)self_1);
    if (this != (FxFunctionCall *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return &((FxFunctionCall *)0x0)->super_FxExpression;
  }
  if (paramcount < (int)(uint)self_1) {
    pcVar8 = FName::GetChars(&this->MethodName);
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,
               "too many parameters for \'%s\' (expected %d, got %d)",pcVar8,(ulong)(uint)paramcount
               ,(ulong)(uint)self_1);
    if (this != (FxFunctionCall *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return &((FxFunctionCall *)0x0)->super_FxExpression;
  }
  local_b9 = 0;
  x_2._7_1_ = 0;
  if (pFStack_20->Function != (PFunction *)0x0) {
    pPVar12 = (PClass *)0x0;
    pVVar6 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                       (&pFStack_20->Function->Variants,0);
    if (((pVVar6->Flags & 2) != 0) &&
       (pPVar12 = PClassActor::RegistrationInfo.MyClass,
       bVar3 = DObject::IsKindOf((DObject *)pFStack_20->Class,PClassActor::RegistrationInfo.MyClass)
       , bVar3)) {
      local_1c8 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pPVar12);
      local_b9 = 1;
      pFVar11 = &(this->super_FxExpression).ScriptPosition;
      local_b8 = local_1c8;
      FxSelf::FxSelf((FxSelf *)local_1c8,pFVar11,false);
      goto LAB_007728e9;
    }
  }
  local_1c8 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar12);
  x_2._7_1_ = 1;
  pFVar11 = &(this->super_FxExpression).ScriptPosition;
  local_c8 = local_1c8;
  FxConstant::FxConstant(local_1c8,pFVar11);
LAB_007728e9:
  local_b0 = local_1c8;
  pPVar12 = (PClass *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pFVar11);
  FxActionSpecialCall::FxActionSpecialCall
            ((FxActionSpecialCall *)pPVar12,&local_b0->super_FxExpression,self_1._4_4_,
             &this->ArgList,&(this->super_FxExpression).ScriptPosition);
  cls = pPVar12;
  if (this != (FxFunctionCall *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])();
  }
  pFVar7 = (FxFunctionCall *)
           (**(code **)(*(long *)&(cls->super_PNativeStruct).super_PStruct.super_PNamedType.
                                  super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
                       0x10))(cls,pFStack_20);
  return &pFVar7->super_FxExpression;
}

Assistant:

FxExpression *FxFunctionCall::Resolve(FCompileContext& ctx)
{
	ABORT(ctx.Class);
	bool error = false;

	for (auto a : ArgList)
	{
		if (a == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Empty function argument.");
			delete this;
			return nullptr;
		}
	}

	PFunction *afd = FindClassMemberFunction(ctx.Class, ctx.Class, MethodName, ScriptPosition, &error);

	if (afd != nullptr)
	{
		if (!CheckFunctionCompatiblity(ScriptPosition, ctx.Function, afd))
		{
			delete this;
			return nullptr;
		}

		auto self = (afd->Variants[0].Flags & VARF_Method)? new FxSelf(ScriptPosition) : nullptr;
		auto x = new FxVMFunctionCall(self, afd, ArgList, ScriptPosition, false);
		delete this;
		return x->Resolve(ctx);
	}

	for (size_t i = 0; i < countof(FxFlops); ++i)
	{
		if (MethodName == FxFlops[i].Name)
		{
			FxExpression *x = new FxFlopFunctionCall(i, ArgList, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}

	int min, max, special;
	if (MethodName == NAME_ACS_NamedExecuteWithResult || MethodName == NAME_CallACS)
	{
		special = -ACS_ExecuteWithResult;
		min = 1;
		max = 5;
	}
	else
	{
		special = P_FindLineSpecial(MethodName.GetChars(), &min, &max);
	}
	if (special != 0 && min >= 0)
	{
		int paramcount = ArgList.Size();
		if (paramcount < min)
		{
			ScriptPosition.Message(MSG_ERROR, "Not enough parameters for '%s' (expected %d, got %d)", 
				MethodName.GetChars(), min, paramcount);
			delete this;
			return nullptr;
		}
		else if (paramcount > max)
		{
			ScriptPosition.Message(MSG_ERROR, "too many parameters for '%s' (expected %d, got %d)", 
				MethodName.GetChars(), max, paramcount);
			delete this;
			return nullptr;
		}
		FxExpression *self = (ctx.Function && (ctx.Function->Variants[0].Flags & VARF_Method) && ctx.Class->IsKindOf(RUNTIME_CLASS(PClassActor))) ? new FxSelf(ScriptPosition) : (FxExpression*)new FxConstant(ScriptPosition);
		FxExpression *x = new FxActionSpecialCall(self, special, ArgList, ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}

	PClass *cls = PClass::FindClass(MethodName);
	if (cls != nullptr && cls->bExported)
	{
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			FxExpression *x = new FxDynamicCast(cls, ArgList[0]);
			ArgList[0] = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			delete this;
			return nullptr;
		}
	}


	// Last but not least: Check builtins and type casts. The random functions can take a named RNG if specified.
	// Note that for all builtins the used arguments have to be nulled in the ArgList so that they won't get deleted before they get used.
	FxExpression *func = nullptr;

	switch (MethodName)
	{
	case NAME_Color:
		if (ArgList.Size() == 3 || ArgList.Size() == 4)
		{
			func = new FxColorLiteral(ArgList, ScriptPosition);
			break;
		}
		// fall through
	case NAME_Bool:
	case NAME_Int:
	case NAME_uInt:
	case NAME_Float:
	case NAME_Double:
	case NAME_Name:
	case NAME_Sound:
	case NAME_State:
	case NAME_SpriteID:
	case NAME_TextureID:
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			PType *type = 
				MethodName == NAME_Bool ? TypeBool :
				MethodName == NAME_Int ? TypeSInt32 :
				MethodName == NAME_uInt ? TypeUInt32 :
				MethodName == NAME_Float ? TypeFloat64 :
				MethodName == NAME_Double ? TypeFloat64 :
				MethodName == NAME_Name ? TypeName :
				MethodName == NAME_SpriteID ? TypeSpriteID :
				MethodName == NAME_TextureID ? TypeTextureID :
				MethodName == NAME_State ? TypeState :
				MethodName == NAME_Color ? TypeColor : (PType*)TypeSound;

			func = new FxTypeCast(ArgList[0], type, true, true);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_GetClass:
		if (CheckArgSize(NAME_GetClass, ArgList, 0, 0, ScriptPosition))
		{
			func = new FxGetClass(new FxSelf(ScriptPosition));
		}
		break;

	case NAME_GetDefaultByType:
		if (CheckArgSize(NAME_GetDefaultByType, ArgList, 1, 1, ScriptPosition))
		{
			func = new FxGetDefaultByType(ArgList[0]);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_Random:
		// allow calling Random without arguments to default to (0, 255)
		if (ArgList.Size() == 0)
		{
			func = new FxRandom(RNG, new FxConstant(0, ScriptPosition), new FxConstant(255, ScriptPosition), ScriptPosition, ctx.FromDecorate);
		}
		else if (CheckArgSize(NAME_Random, ArgList, 2, 2, ScriptPosition))
		{
			func = new FxRandom(RNG, ArgList[0], ArgList[1], ScriptPosition, ctx.FromDecorate);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	case NAME_FRandom:
		if (CheckArgSize(NAME_FRandom, ArgList, 2, 2, ScriptPosition))
		{
			func = new FxFRandom(RNG, ArgList[0], ArgList[1], ScriptPosition);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	case NAME_RandomPick:
	case NAME_FRandomPick:
		if (CheckArgSize(MethodName, ArgList, 1, -1, ScriptPosition))
		{
			func = new FxRandomPick(RNG, ArgList, MethodName == NAME_FRandomPick, ScriptPosition, ctx.FromDecorate);
		}
		break;

	case NAME_Random2:
		if (CheckArgSize(NAME_Random2, ArgList, 0, 1, ScriptPosition))
		{
			func = new FxRandom2(RNG, ArgList.Size() == 0? nullptr : ArgList[0], ScriptPosition, ctx.FromDecorate);
			if (ArgList.Size() > 0) ArgList[0] = nullptr;
		}
		break;

	case NAME_Min:
	case NAME_Max:
		if (CheckArgSize(MethodName, ArgList, 2, -1, ScriptPosition))
		{
			func = new FxMinMax(ArgList, MethodName, ScriptPosition);
		}
		break;

	case NAME_Clamp:
		if (CheckArgSize(MethodName, ArgList, 3, 3, ScriptPosition))
		{
			TArray<FxExpression *> pass;
			pass.Resize(2);
			pass[0] = ArgList[0];
			pass[1] = ArgList[1];
			pass[0] = new FxMinMax(pass, NAME_Max, ScriptPosition);
			pass[1] = ArgList[2];
			func = new FxMinMax(pass, NAME_Min, ScriptPosition);
			ArgList[0] = ArgList[1] = ArgList[2] = nullptr;
		}
		break;

	case NAME_Abs:
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			func = new FxAbs(ArgList[0]);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_ATan2:
	case NAME_VectorAngle:
		if (CheckArgSize(MethodName, ArgList, 2, 2, ScriptPosition))
		{
			func = MethodName == NAME_ATan2 ? new FxATan2(ArgList[0], ArgList[1], ScriptPosition) : new FxATan2(ArgList[1], ArgList[0], ScriptPosition);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	default:
		ScriptPosition.Message(MSG_ERROR, "Call to unknown function '%s'", MethodName.GetChars());
		break;
	}
	if (func != nullptr)
	{
		delete this;
		return func->Resolve(ctx);
	}
	delete this;
	return nullptr;
}